

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O3

Z80Cond Z80::getz80cond_Z80(char **p)

{
  char *pcVar1;
  byte bVar2;
  int iVar3;
  byte bVar4;
  
  iVar3 = SkipBlanks(&lp);
  pcVar1 = lp;
  if (iVar3 != 0) {
    return Z80C_UNK;
  }
  bVar4 = *lp | 0x20;
  iVar3 = islabchar(lp[1]);
  if (iVar3 == 0) {
    lp = lp + 1;
    if (bVar4 < 0x70) {
      if (bVar4 == 99) {
        return Z80C_C;
      }
      if (bVar4 == 0x6d) {
        return Z80C_M;
      }
    }
    else {
      if (bVar4 == 0x70) {
        return Z80C_P;
      }
      if (bVar4 == 0x73) {
        return Z80C_M;
      }
      if (bVar4 == 0x7a) {
        return Z80C_Z;
      }
    }
  }
  else {
    if (((lp[1] ^ *lp) & 0x20U) != 0) {
      return Z80C_UNK;
    }
    iVar3 = islabchar(lp[2]);
    if (iVar3 != 0) {
      return Z80C_UNK;
    }
    bVar2 = lp[1] | 0x20;
    lp = lp + 2;
    if (bVar4 == 0x70) {
      if (bVar2 == 0x6f) {
        return Z80C_PO;
      }
      if (bVar2 == 0x65) {
        return Z80C_PE;
      }
    }
    else if (bVar4 == 0x6e) {
      if (bVar2 == 0x7a) {
        return Z80C_NZ;
      }
      if (bVar2 == 0x73) {
        return Z80C_P;
      }
      if (bVar2 == 99) {
        return Z80C_NC;
      }
    }
  }
  lp = pcVar1;
  return Z80C_UNK;
}

Assistant:

static Z80Cond getz80cond_Z80(char*& p) {
		if (SkipBlanks(p)) return Z80C_UNK;	// EOL detected
		char * const pp = p;
		const char p0 = 0x20|p[0];		// lowercase ASCII conversion
		if (!islabchar(p[1])) {			// can be only single letter condition at most
			++p;
			switch (p0) {
				case 'z': return Z80C_Z;
				case 'c': return Z80C_C;
				case 'p': return Z80C_P;
				case 'm': return Z80C_M;
				case 's': return Z80C_M;
			}
			p = pp;
			return Z80C_UNK;
		}
		// ## p0 != 0 && p1 is label character
		if ((p[0]^p[1])&0x20) return Z80C_UNK;	// different case of the letters detected
		if (islabchar(p[2])) return Z80C_UNK;	// p2 is also label character = too many
		const char p1 = 0x20|p[1];		// lowercase ASCII conversion
		p += 2;
		if ('n' == p0) {
			switch (p1) {
				case 'z': return Z80C_NZ;	// nz
				case 'c': return Z80C_NC;	// nc
				case 's': return Z80C_P;	// ns
			}
		} else if ('p' == p0) {
			switch (p1) {
				case 'o': return Z80C_PO;	// po
				case 'e': return Z80C_PE;	// pe
			}
		}
		p = pp;
		return Z80C_UNK;
	}